

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum
pbrt::G(Integrator *integrator,SamplerHandle sampler,Vertex *v0,Vertex *v1,
       SampledWavelengths *lambda)

{
  anon_union_248_3_83785cfc_for_Vertex_2 *this;
  anon_union_248_3_83785cfc_for_Vertex_2 *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  uint64_t sequenceIndex;
  uint64_t seed;
  Normal3f *pNVar7;
  pbrt *ppVar8;
  type tVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  float a;
  float fVar17;
  undefined1 auVar18 [16];
  SampledSpectrum SVar19;
  Point3f PVar20;
  Point3f PVar21;
  RNG rng;
  Tuple3<pbrt::Vector3,_float> local_60;
  SampledSpectrum local_50;
  RNG local_40;
  undefined1 auVar16 [56];
  
  auVar14 = in_ZMM0._8_56_;
  this = &v0->field_2;
  PVar20 = Interaction::p(&(this->ei).super_Interaction);
  auVar11._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  this_00 = &v1->field_2;
  PVar21 = Interaction::p(&(this_00->ei).super_Interaction);
  auVar12._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar14;
  local_60.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z -
               PVar21.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5 = vsubps_avx(auVar11._0_16_,auVar12._0_16_);
  fVar1 = auVar5._0_4_;
  auVar18._0_4_ = fVar1 * fVar1;
  fVar2 = auVar5._4_4_;
  auVar18._4_4_ = fVar2 * fVar2;
  fVar3 = auVar5._8_4_;
  auVar18._8_4_ = fVar3 * fVar3;
  fVar4 = auVar5._12_4_;
  auVar18._12_4_ = fVar4 * fVar4;
  auVar10 = vmovshdup_avx(auVar18);
  auVar10 = vfmadd231ss_fma(auVar10,auVar5,auVar5);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_60.z),ZEXT416((uint)local_60.z));
  a = 1.0 / auVar10._0_4_;
  auVar10 = vsqrtss_avx(ZEXT416((uint)a),ZEXT416((uint)a));
  fVar17 = auVar10._0_4_;
  local_60.z = local_60.z * fVar17;
  auVar16 = SUB6056((undefined1  [60])0x0,4);
  auVar10._0_4_ = fVar1 * fVar17;
  auVar10._4_4_ = fVar2 * fVar17;
  auVar10._8_4_ = fVar3 * fVar17;
  auVar10._12_4_ = fVar4 * fVar17;
  auVar14 = ZEXT856(auVar10._8_8_);
  local_60._0_8_ = vmovlps_avx(auVar10);
  bVar6 = Vertex::IsOnSurface(v0);
  if (bVar6) {
    pNVar7 = &(v0->field_2).ei.super_Interaction.n;
    if (v0->type == Surface) {
      pNVar7 = (Normal3f *)((v0->field_2).mi.sigma_maj.values.values + 2);
    }
    tVar9 = AbsDot<float>(pNVar7,(Vector3<float> *)&local_60);
    a = a * tVar9;
    auVar16 = SUB6056((undefined1  [60])0x0,4);
    auVar14 = extraout_var;
  }
  bVar6 = Vertex::IsOnSurface(v1);
  if (bVar6) {
    pNVar7 = &(v1->field_2).ei.super_Interaction.n;
    if (v1->type == Surface) {
      pNVar7 = (Normal3f *)((v1->field_2).mi.sigma_maj.values.values + 2);
    }
    tVar9 = AbsDot<float>(pNVar7,(Vector3<float> *)&local_60);
    a = a * tVar9;
    auVar16 = SUB6056((undefined1  [60])0x0,4);
    auVar14 = extraout_var_00;
  }
  ppVar8 = (pbrt *)this;
  PVar20 = Interaction::p(&(this->ei).super_Interaction);
  sequenceIndex =
       Hash<pbrt::Point3<float>>(ppVar8,(Point3<float>)PVar20.super_Tuple3<pbrt::Point3,_float>);
  ppVar8 = (pbrt *)this_00;
  PVar20 = Interaction::p(&(this_00->ei).super_Interaction);
  seed = Hash<pbrt::Point3<float>>(ppVar8,(Point3<float>)PVar20.super_Tuple3<pbrt::Point3,_float>);
  RNG::SetSequence(&local_40,sequenceIndex,seed);
  SVar19 = Integrator::Tr(integrator,&(this->ei).super_Interaction,&(this_00->ei).super_Interaction,
                          lambda,&local_40);
  auVar15._0_8_ = SVar19.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar13._0_8_ = SVar19.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar15._0_16_);
  SVar19 = SampledSpectrum::operator*(&local_50,a);
  return (array<float,_4>)(array<float,_4>)SVar19;
}

Assistant:

SampledSpectrum G(const Integrator &integrator, SamplerHandle sampler, const Vertex &v0,
                  const Vertex &v1, const SampledWavelengths &lambda) {
    Vector3f d = v0.p() - v1.p();
    Float g = 1 / LengthSquared(d);
    d *= std::sqrt(g);
    if (v0.IsOnSurface())
        g *= AbsDot(v0.ns(), d);
    if (v1.IsOnSurface())
        g *= AbsDot(v1.ns(), d);
    RNG rng(Hash(v0.p()), Hash(v1.p()));
    return g * integrator.Tr(v0.GetInteraction(), v1.GetInteraction(), lambda, rng);
}